

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

void ssh_bpp_input_raw_data_callback(void *context)

{
  Ssh *ssh;
  
  ssh = *(Ssh **)((long)context + 0xa0);
  (**(code **)(*context + 8))();
  ssh_conn_processed_data(ssh);
  return;
}

Assistant:

static void ssh_bpp_input_raw_data_callback(void *context)
{
    BinaryPacketProtocol *bpp = (BinaryPacketProtocol *)context;
    Ssh *ssh = bpp->ssh;               /* in case bpp is about to get freed */
    ssh_bpp_handle_input(bpp);
    /* If we've now cleared enough backlog on the input connection, we
     * may need to unfreeze it. */
    ssh_conn_processed_data(ssh);
}